

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ReshapeLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reshapelike(NeuralNetworkLayer *this)

{
  ReshapeLikeLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x46f) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x46f;
    this_00 = (ReshapeLikeLayerParams *)operator_new(0x18);
    ReshapeLikeLayerParams::ReshapeLikeLayerParams(this_00);
    (this->layer_).reshapelike_ = this_00;
  }
  return (ReshapeLikeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReshapeLikeLayerParams* NeuralNetworkLayer::mutable_reshapelike() {
  if (!has_reshapelike()) {
    clear_layer();
    set_has_reshapelike();
    layer_.reshapelike_ = new ::CoreML::Specification::ReshapeLikeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reshapeLike)
  return layer_.reshapelike_;
}